

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O2

t_object * __thiscall
xemmai::t_heap<xemmai::t_object>::t_of<0UL,_65536UL>::f_allocate
          (t_of<0UL,_65536UL> *this,t_heap<xemmai::t_object> *a_heap)

{
  bool bVar1;
  __base_type local_28;
  
  local_28._M_p = (this->v_chunks)._M_b._M_p;
  if (local_28._M_p != (t_object *)0x0) {
    do {
      bVar1 = std::atomic<xemmai::t_object_*>::compare_exchange_weak
                        (&this->v_chunks,&local_28._M_p,(local_28._M_p)->v_previous,acquire);
      if (bVar1) break;
    } while (local_28._M_p != (t_object *)0x0);
    if (local_28._M_p != (t_object *)0x0) goto LAB_00108411;
  }
  local_28._M_p = f_grow(this,a_heap);
LAB_00108411:
  LOCK();
  (this->v_allocated).super___atomic_base<unsigned_long>._M_i =
       (this->v_allocated).super___atomic_base<unsigned_long>._M_i + (local_28._M_p)->v_cyclic;
  UNLOCK();
  return local_28._M_p;
}

Assistant:

T* f_allocate(t_heap& a_heap)
		{
			auto p = v_chunks.load(std::memory_order_acquire);
			while (p && !v_chunks.compare_exchange_weak(p, p->v_previous, std::memory_order_acquire));
			if (!p) p = f_grow(a_heap);
			v_allocated.fetch_add(p->v_cyclic, std::memory_order_relaxed);
			return p;
		}